

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

bool __thiscall QHttpNetworkConnectionChannel::resetUploadData(QHttpNetworkConnectionChannel *this)

{
  ConnectionType CVar1;
  QNonContiguousByteDevice *pQVar2;
  ulong uVar3;
  QHttpNetworkConnection *in_RDI;
  NetworkError in_stack_0000000c;
  QNonContiguousByteDevice *uploadByteDevice;
  QHttpNetworkConnectionPrivate *in_stack_00000020;
  bool local_1;
  
  if (*(long *)&in_RDI[3].field_0x8 == 0) {
    local_1 = false;
  }
  else {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb139);
    CVar1 = QHttpNetworkConnection::connectionType(in_RDI);
    if (((CVar1 != ConnectionTypeHTTP2Direct) && ((in_RDI[8].field_0x8 & 1) == 0)) &&
       (pQVar2 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2fb164),
       pQVar2 != (QNonContiguousByteDevice *)0x0)) {
      uVar3 = (**(code **)(*(long *)pQVar2 + 0x80))();
      if ((uVar3 & 1) == 0) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fb194);
        QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fb19c);
        QHttpNetworkConnectionPrivate::emitReplyError
                  (in_stack_00000020,(QIODevice *)this,(QHttpNetworkReply *)uploadByteDevice,
                   in_stack_0000000c);
        return false;
      }
      *(undefined8 *)(in_RDI + 4) = 0;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool QHttpNetworkConnectionChannel::resetUploadData()
{
    if (!reply) {
        //this happens if server closes connection while QHttpNetworkConnectionPrivate::_q_startNextRequest is pending
        return false;
    }
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct
        || switchedToHttp2) {
        // The else branch doesn't make any sense for HTTP/2, since 1 channel is multiplexed into
        // many streams. And having one stream fail to reset upload data should not completely close
        // the channel. Handled in the http2 protocol handler.
    } else if (QNonContiguousByteDevice *uploadByteDevice = request.uploadByteDevice()) {
        if (!uploadByteDevice->reset()) {
            connection->d_func()->emitReplyError(socket, reply, QNetworkReply::ContentReSendError);
            return false;
        }
        written = 0;
    }
    return true;
}